

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O2

bool __thiscall luna::VM::Call(VM *this,Value *a,Instruction i)

{
  bool bVar1;
  
  if ((a->type_ != ValueT_Closure) && (a->type_ != ValueT_CFunction)) {
    ReportTypeError(this,a,"call");
  }
  bVar1 = State::CallFunction(this->state_,a,(i.opcode_ >> 8 & 0xff) - 1,(i.opcode_ & 0xff) - 1);
  return bVar1;
}

Assistant:

bool VM::Call(Value *a, Instruction i)
    {
        if (a->type_ != ValueT_Closure &&
            a->type_ != ValueT_CFunction)
        {
            ReportTypeError(a, "call");
            return true;
        }

        try
        {
            int arg_count = Instruction::GetParamB(i) - 1;
            int expect_result = Instruction::GetParamC(i) - 1;
            return state_->CallFunction(a, arg_count, expect_result);
        } catch (const CallCFuncException &e)
        {
            // Calculate line number of the call
            auto pos = GetCurrentInstructionPos();
            throw RuntimeException(pos.first, pos.second, e.What().c_str());
        }
    }